

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapePrism> *this,TPZCompMesh *mesh,
          TPZCompElH1<pzshape::TPZShapePrism> *copy)

{
  long local_28;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_0178d450;
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapePrism>,&PTR_PTR_017870a8,mesh,
             &copy->super_TPZIntelGen<pzshape::TPZShapePrism>);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_01786cd8;
  local_28 = -1;
  TPZManVector<long,_21>::TPZManVector(&this->fConnectIndexes,0x15,&local_28);
  this->fh1fam = copy->fh1fam;
  TPZManVector<long,_21>::operator=(&this->fConnectIndexes,&copy->fConnectIndexes);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh, const TPZCompElH1<TSHAPE> &copy) : TPZRegisterClassId(&TPZCompElH1::ClassId),
                                                                                       TPZIntelGen<TSHAPE>(mesh,copy), fh1fam(copy.fh1fam){
	this->fConnectIndexes = copy.fConnectIndexes;
}